

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstate.c
# Opt level: O0

lua_State * lua_newthread(lua_State *L)

{
  global_State *g_00;
  StkId pTVar1;
  lua_State *plVar2;
  long lVar3;
  int iVar4;
  undefined8 *puVar5;
  lua_State *L_00;
  lua_State *x_;
  TValue *io;
  lua_State *L1;
  global_State *g;
  lua_State *L_local;
  
  iVar4 = **(int **)&L[-1].hookmask;
  **(int **)&L[-1].hookmask = iVar4 + 1;
  if (iVar4 != 0) {
    __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lstate.c"
                  ,0x11b,"lua_State *lua_newthread(lua_State *)");
  }
  g_00 = L->l_G;
  if (0 < L->l_G->GCdebt) {
    luaC_step(L);
  }
  puVar5 = (undefined8 *)luaM_realloc_(L,(void *)0x0,8,0xe0);
  L_00 = (lua_State *)(puVar5 + 2);
  *(byte *)((long)puVar5 + 0x19) = g_00->currentwhite & 0x18;
  *(undefined1 *)(puVar5 + 3) = 8;
  L_00->next = g_00->allgc;
  if (9 < (*(byte *)(puVar5 + 3) & 0xf)) {
    __assert_fail("(((L1)->tt) & 0x0F) < (9+1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lstate.c"
                  ,0x124,"lua_State *lua_newthread(lua_State *)");
  }
  g_00->allgc = (GCObject *)L_00;
  pTVar1 = L->top;
  if (9 < (*(byte *)(puVar5 + 3) & 0xf)) {
    __assert_fail("(((x_)->tt) & 0x0F) < (9+1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lstate.c"
                  ,0x126,"lua_State *lua_newthread(lua_State *)");
  }
  (pTVar1->value_).gc = (GCObject *)L_00;
  pTVar1->tt_ = 0x8008;
  if ((pTVar1->tt_ & 0x8000) != 0) {
    if ((pTVar1->tt_ & 0x8000) == 0) {
      __assert_fail("(((io)->tt_) & (1 << 15))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lstate.c"
                    ,0x126,"lua_State *lua_newthread(lua_State *)");
    }
    if ((pTVar1->tt_ & 0x7f) != (ushort)((pTVar1->value_).gc)->tt) {
LAB_0013495e:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lstate.c"
                    ,0x126,"lua_State *lua_newthread(lua_State *)");
    }
    if (L != (lua_State *)0x0) {
      if ((pTVar1->tt_ & 0x8000) == 0) {
        __assert_fail("(((io)->tt_) & (1 << 15))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lstate.c"
                      ,0x126,"lua_State *lua_newthread(lua_State *)");
      }
      if ((((pTVar1->value_).gc)->marked & (L->l_G->currentwhite ^ 0x18)) != 0) goto LAB_0013495e;
    }
  }
  L->top = L->top + 1;
  if (L->ci->top < L->top) {
    __assert_fail("(L->top <= L->ci->top) && \"stack overflow\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lstate.c"
                  ,0x127,"lua_State *lua_newthread(lua_State *)");
  }
  preinit_thread(L_00,g_00);
  *(lu_byte *)(puVar5 + 0x1b) = L->hookmask;
  *(int *)((long)puVar5 + 0xcc) = L->basehookcount;
  puVar5[0x17] = L->hook;
  *(undefined4 *)(puVar5 + 0x1a) = *(undefined4 *)((long)puVar5 + 0xcc);
  plVar2 = g_00->mainthread;
  *puVar5 = *(undefined8 *)&plVar2[-1].hookcount;
  puVar5[1] = *(undefined8 *)&plVar2[-1].hookmask;
  lVar3._0_1_ = L[-1].hookmask;
  lVar3._1_1_ = L[-1].allowhook;
  lVar3._2_2_ = L[-1].nci;
  lVar3._4_1_ = L[-1].magic;
  lVar3._5_3_ = *(undefined3 *)&L[-1].field_0xcd;
  if (puVar5[1] == lVar3) {
    stack_init(L_00,L);
    iVar4 = **(int **)&L[-1].hookmask + -1;
    **(int **)&L[-1].hookmask = iVar4;
    if (iVar4 != 0) {
      __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lstate.c"
                    ,0x132,"lua_State *lua_newthread(lua_State *)");
    }
    return L_00;
  }
  __assert_fail("((struct L_EXTRA*)(((void *)((char *)(L1) - sizeof(struct L_EXTRA)))))->plock == ((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lstate.c"
                ,0x130,"lua_State *lua_newthread(lua_State *)");
}

Assistant:

LUA_API lua_State *lua_newthread (lua_State *L) {
  global_State *g;
  lua_State *L1;
  lua_lock(L);
  g = G(L);
  luaC_checkGC(L);
  /* create new thread */
  L1 = &cast(LX *, luaM_newobject(L, LUA_TTHREAD, sizeof(LX)))->l;
  L1->marked = luaC_white(g);
  L1->tt = LUA_TTHREAD;
  /* link it on list 'allgc' */
  L1->next = g->allgc;
  g->allgc = obj2gco(L1);
  /* anchor it on L stack */
  setthvalue(L, L->top, L1);
  api_incr_top(L);
  preinit_thread(L1, g);
  L1->hookmask = L->hookmask;
  L1->basehookcount = L->basehookcount;
  L1->hook = L->hook;
  resethookcount(L1);
  /* initialize L1 extra space */
  memcpy(lua_getextraspace(L1), lua_getextraspace(g->mainthread),
         LUA_EXTRASPACE);
  luai_userstatethread(L, L1);
  stack_init(L1, L);  /* init stack */
  lua_unlock(L);
  return L1;
}